

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_mark.cpp
# Opt level: O1

Read<signed_char> __thiscall
Omega_h::mark_class_closures
          (Omega_h *this,Mesh *mesh,Int ent_dim,
          vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_> *class_pairs)

{
  int *piVar1;
  Alloc *pAVar2;
  LO size_in;
  uint uVar3;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *pvVar4;
  void *extraout_RDX_02;
  void *extraout_RDX_03;
  void *extraout_RDX_04;
  void *extraout_RDX_05;
  void *extraout_RDX_06;
  Int class_dim;
  bool bVar5;
  Bytes BVar6;
  Read<signed_char> RVar7;
  vector<int,_std::allocator<int>_> dim_class_ids;
  Read<signed_char> class_dim_marks;
  string local_98;
  Bytes local_78;
  Bytes local_68;
  Alloc *local_58;
  void *local_50;
  long *local_48;
  undefined8 uStack_40;
  
  size_in = Mesh::nents(mesh,ent_dim);
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"");
  Read<signed_char>::Read((Read<signed_char> *)this,size_in,'\0',&local_98);
  pvVar4 = extraout_RDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    pvVar4 = extraout_RDX_00;
  }
  uVar3 = mesh->dim_;
  if (uVar3 < 4) {
    class_dim = ent_dim;
    do {
      if ((int)uVar3 < class_dim) {
        RVar7.write_.shared_alloc_.direct_ptr = pvVar4;
        RVar7.write_.shared_alloc_.alloc = (Alloc *)this;
        return (Read<signed_char>)RVar7.write_.shared_alloc_;
      }
      get_dim_class_ids((vector<int,_std::allocator<int>_> *)&local_98,class_dim,class_pairs);
      pvVar4 = extraout_RDX_01;
      if (local_98._M_dataplus._M_p != (pointer)local_98._M_string_length) {
        mark_class_closures((Omega_h *)&local_58,mesh,ent_dim,class_dim,
                            (vector<int,_std::allocator<int>_> *)&local_98);
        local_68.write_.shared_alloc_.alloc = *(Alloc **)this;
        if (((ulong)local_68.write_.shared_alloc_.alloc & 7) == 0 &&
            local_68.write_.shared_alloc_.alloc != (Alloc *)0x0) {
          if (entering_parallel == '\x01') {
            local_68.write_.shared_alloc_.alloc =
                 (Alloc *)((local_68.write_.shared_alloc_.alloc)->size * 8 + 1);
          }
          else {
            (local_68.write_.shared_alloc_.alloc)->use_count =
                 (local_68.write_.shared_alloc_.alloc)->use_count + 1;
          }
        }
        local_68.write_.shared_alloc_.direct_ptr = *(void **)(this + 8);
        local_78.write_.shared_alloc_.alloc = local_58;
        if (((ulong)local_58 & 7) == 0 && local_58 != (Alloc *)0x0) {
          if (entering_parallel == '\x01') {
            local_78.write_.shared_alloc_.alloc = (Alloc *)(local_58->size * 8 + 1);
          }
          else {
            local_58->use_count = local_58->use_count + 1;
          }
        }
        local_78.write_.shared_alloc_.direct_ptr = local_50;
        BVar6 = lor_each((Omega_h *)&local_48,&local_68,&local_78);
        pvVar4 = BVar6.write_.shared_alloc_.direct_ptr;
        pAVar2 = *(Alloc **)this;
        if (((ulong)pAVar2 & 7) == 0 && pAVar2 != (Alloc *)0x0) {
          piVar1 = &pAVar2->use_count;
          *piVar1 = *piVar1 + -1;
          if (*piVar1 == 0) {
            Alloc::~Alloc(pAVar2);
            operator_delete(pAVar2,0x48);
            pvVar4 = extraout_RDX_02;
          }
        }
        pAVar2 = local_78.write_.shared_alloc_.alloc;
        *(long **)this = local_48;
        *(undefined8 *)(this + 8) = uStack_40;
        bVar5 = ((ulong)local_48 & 7) != 0;
        pvVar4 = (void *)CONCAT71((int7)((ulong)pvVar4 >> 8),bVar5 || local_48 == (long *)0x0);
        if ((!bVar5 && local_48 != (long *)0x0) && (entering_parallel == '\x01')) {
          *(int *)(local_48 + 6) = (int)local_48[6] + -1;
          *(long *)this = *local_48 * 8 + 1;
        }
        local_48 = (long *)0x0;
        uStack_40 = 0;
        if (((ulong)local_78.write_.shared_alloc_.alloc & 7) == 0 &&
            local_78.write_.shared_alloc_.alloc != (Alloc *)0x0) {
          piVar1 = &(local_78.write_.shared_alloc_.alloc)->use_count;
          *piVar1 = *piVar1 + -1;
          if (*piVar1 == 0) {
            Alloc::~Alloc(local_78.write_.shared_alloc_.alloc);
            operator_delete(pAVar2,0x48);
            pvVar4 = extraout_RDX_03;
          }
        }
        pAVar2 = local_68.write_.shared_alloc_.alloc;
        if (((ulong)local_68.write_.shared_alloc_.alloc & 7) == 0 &&
            local_68.write_.shared_alloc_.alloc != (Alloc *)0x0) {
          piVar1 = &(local_68.write_.shared_alloc_.alloc)->use_count;
          *piVar1 = *piVar1 + -1;
          if (*piVar1 == 0) {
            Alloc::~Alloc(local_68.write_.shared_alloc_.alloc);
            operator_delete(pAVar2,0x48);
            pvVar4 = extraout_RDX_04;
          }
        }
        pAVar2 = local_58;
        if (((ulong)local_58 & 7) == 0 && local_58 != (Alloc *)0x0) {
          piVar1 = &local_58->use_count;
          *piVar1 = *piVar1 + -1;
          if (*piVar1 == 0) {
            Alloc::~Alloc(local_58);
            operator_delete(pAVar2,0x48);
            pvVar4 = extraout_RDX_05;
          }
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        operator_delete(local_98._M_dataplus._M_p,
                        local_98.field_2._M_allocated_capacity - (long)local_98._M_dataplus._M_p);
        pvVar4 = extraout_RDX_06;
      }
      class_dim = class_dim + 1;
      uVar3 = mesh->dim_;
    } while (uVar3 < 4);
  }
  fail("assertion %s failed at %s +%d\n","0 <= dim_ && dim_ <= 3",
       "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_mesh.hpp"
       ,0x33);
}

Assistant:

Read<I8> mark_class_closures(
    Mesh* mesh, Int ent_dim, std::vector<ClassPair> const& class_pairs) {
  auto marks = Read<I8>(mesh->nents(ent_dim), I8(0));
  for (Int class_dim = ent_dim; class_dim <= mesh->dim(); ++class_dim) {
    auto dim_class_ids = get_dim_class_ids(class_dim, class_pairs);
    if (dim_class_ids.empty()) continue;
    auto class_dim_marks =
        mark_class_closures(mesh, ent_dim, class_dim, dim_class_ids);
    marks = lor_each(marks, class_dim_marks);
  }
  return marks;
}